

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Totals * __thiscall Catch::anon_unknown_26::TestGroup::execute(TestGroup *this)

{
  long *plVar1;
  bool bVar2;
  TestCaseInfo *pTVar3;
  undefined8 *in_RSI;
  Totals *in_RDI;
  FilterMatch *match;
  iterator __end2_1;
  iterator __begin2_1;
  Matches *__range2_1;
  TestCaseHandle **testCase;
  iterator __end2;
  iterator __begin2;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *__range2;
  TestCaseHandle *in_stack_00000268;
  RunContext *in_stack_00000270;
  Totals *in_stack_ffffffffffffff38;
  RunContext *in_stack_ffffffffffffff40;
  Totals *this_00;
  undefined8 local_98;
  undefined8 local_90;
  __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
  local_78;
  undefined8 *local_70;
  reference local_28;
  _Self local_20;
  _Self local_18;
  undefined8 *local_10;
  
  this_00 = in_RDI;
  Totals::Totals((Totals *)in_stack_ffffffffffffff40);
  local_10 = in_RSI + 0x3b;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
       ::begin((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                *)in_stack_ffffffffffffff38);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
       ::end((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)in_stack_ffffffffffffff38);
  while (bVar2 = std::operator!=(&local_18,&local_20), bVar2) {
    local_28 = std::_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*>::operator*
                         ((_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> *)0x17fdb6);
    bVar2 = RunContext::aborting(in_stack_ffffffffffffff40);
    if (bVar2) {
      plVar1 = (long *)*in_RSI;
      pTVar3 = TestCaseHandle::getTestCaseInfo(*local_28);
      (**(code **)(*plVar1 + 0x90))(plVar1,pTVar3);
    }
    else {
      RunContext::runTest(in_stack_00000270,in_stack_00000268);
      Totals::operator+=((Totals *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    std::_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*>::operator++
              ((_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> *)in_stack_ffffffffffffff40);
  }
  local_70 = in_RSI + 0x41;
  local_78._M_current =
       (FilterMatch *)
       std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
       begin((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
             in_stack_ffffffffffffff38);
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::end
            ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
             in_stack_ffffffffffffff38);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                             *)in_stack_ffffffffffffff38), bVar2) {
    __gnu_cxx::
    __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
    ::operator*(&local_78);
    bVar2 = std::
            vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
            empty((vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   *)this_00);
    if (bVar2) {
      *(undefined1 *)(in_RSI + 0x44) = 1;
      in_stack_ffffffffffffff40 = (RunContext *)*in_RSI;
      StringRef::StringRef
                ((StringRef *)in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38);
      (**(code **)((char *)((Counts *)&in_stack_ffffffffffffff40->super_IResultCapture)->passed +
                  0x10))(in_stack_ffffffffffffff40,local_98,local_90);
    }
    __gnu_cxx::
    __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
    ::operator++(&local_78);
  }
  return in_RDI;
}

Assistant:

Totals execute() {
                Totals totals;
                for (auto const& testCase : m_tests) {
                    if (!m_context.aborting())
                        totals += m_context.runTest(*testCase);
                    else
                        m_reporter->skipTest(testCase->getTestCaseInfo());
                }

                for (auto const& match : m_matches) {
                    if (match.tests.empty()) {
                        m_unmatchedTestSpecs = true;
                        m_reporter->noMatchingTestCases( match.name );
                    }
                }

                return totals;
            }